

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uint uVar1;
  uchar *__ptr;
  float *pfVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  float *pfVar9;
  uchar *puVar10;
  float fVar11;
  
  __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
  if (__ptr == (uchar *)0x0) {
    stbi__g_failure_reason = "unknown image type";
  }
  else {
    uVar1 = *x;
    uVar6 = *y;
    if (req_comp == 0) {
      req_comp = *comp;
    }
    if ((((-1 < (int)(uVar6 | uVar1)) &&
         (((uVar6 == 0 || ((int)uVar1 <= (int)(0x7fffffff / (ulong)uVar6))) &&
          (uVar6 = uVar6 * uVar1, -1 < (int)(req_comp | uVar6))))) &&
        ((req_comp == 0 ||
         (((int)uVar6 <= (int)(0x7fffffff / (ulong)(uint)req_comp) &&
          (req_comp * uVar6 < 0x20000000)))))) &&
       (pfVar2 = (float *)malloc((long)(int)(uVar6 * req_comp * 4)), pfVar2 != (float *)0x0)) {
      uVar1 = req_comp - (uint)((req_comp & 1U) == 0);
      if (0 < (int)uVar6) {
        lVar4 = (long)req_comp;
        uVar7 = (ulong)uVar6;
        uVar8 = 0;
        pfVar9 = pfVar2;
        puVar10 = __ptr;
        do {
          if (0 < (int)uVar1) {
            uVar5 = 0;
            do {
              fVar11 = powf((float)puVar10[uVar5] / 255.0,stbi__l2h_gamma);
              pfVar9[uVar5] = fVar11 * stbi__l2h_scale;
              uVar5 = uVar5 + 1;
            } while (uVar1 != uVar5);
          }
          uVar8 = uVar8 + 1;
          pfVar9 = pfVar9 + lVar4;
          puVar10 = puVar10 + lVar4;
        } while (uVar8 != uVar7);
        if ((req_comp & 1U) == 0) {
          lVar3 = (long)(int)uVar1;
          do {
            pfVar2[lVar3] = (float)__ptr[lVar3] / 255.0;
            lVar3 = lVar3 + lVar4;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
      }
      free(__ptr);
      return pfVar2;
    }
    free(__ptr);
    stbi__g_failure_reason = "outofmem";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}